

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

TSNode * ts_node_named_descendant_for_byte_range
                   (TSNode *__return_storage_ptr__,TSNode self,uint32_t min,uint32_t max)

{
  SubtreeHeapData *pSVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  TSTree *pTVar7;
  TSNode child;
  Subtree local_80;
  TSTree *local_78;
  uint32_t local_70;
  uint32_t uStack_6c;
  uint32_t uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  TSSymbol *local_58;
  TSNode local_50;
  
  __return_storage_ptr__->context[0] = self.context[0];
  __return_storage_ptr__->context[1] = self.context[1];
  __return_storage_ptr__->context[2] = self.context[2];
  __return_storage_ptr__->context[3] = self.context[3];
  __return_storage_ptr__->id = self.id;
  __return_storage_ptr__->tree = self.tree;
  pTVar7 = self.tree;
  uVar3 = self.context[2];
LAB_0012a3fa:
  uStack_68 = uVar3;
  local_80 = *self.id;
  local_78 = pTVar7;
  if ((((ulong)local_80.ptr & 1) == 0) && ((local_80.ptr)->child_count != 0)) {
    uVar6 = (ulong)((local_80.ptr)->field_17).field_0.alias_sequence_id;
    if (uVar6 == 0) {
      local_58 = (TSSymbol *)0x0;
    }
    else {
      local_58 = pTVar7->language->alias_sequences +
                 pTVar7->language->max_alias_sequence_length * uVar6;
    }
    uStack_64 = 0;
    uStack_60 = 0;
    local_70 = self.context[0];
    uStack_6c = self.context[1];
  }
  else {
    local_80.ptr = (SubtreeHeapData *)0x0;
    local_58 = (TSSymbol *)0x0;
    local_70 = 0;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
  }
  do {
    _Var4 = ts_node_child_iterator_next((NodeChildIterator *)&local_80.data,&local_50);
    pTVar7 = local_50.tree;
    self.id = local_50.id;
    uVar2 = local_50.context[3];
    uVar3 = local_50.context[2];
    self.context[1] = local_50.context[1];
    self.context[0] = local_50.context[0];
    if (!_Var4) {
      return __return_storage_ptr__;
    }
  } while (local_70 <= max);
  if (min < local_50.context[0]) {
    return __return_storage_ptr__;
  }
  pSVar1 = *local_50.id;
  if (((ulong)pSVar1 & 1) == 0) {
    uVar5 = (uint)*(ushort *)&pSVar1->field_0x2c;
  }
  else {
    uVar5 = (uint)((ulong)pSVar1 >> 1) & 0x7fffffff;
  }
  if ((uVar5 & 1) == 0) goto LAB_0012a4e2;
  if (((ulong)pSVar1 & 1) == 0) {
    uVar5 = *(uint *)&pSVar1->field_0x2c >> 1;
  }
  else {
    uVar5 = (uint)pSVar1 >> 2;
  }
  if ((uVar5 & 1) == 0) goto LAB_0012a4e2;
  goto LAB_0012a513;
LAB_0012a4e2:
  if (((local_50.context[3] != 0) && ((short)local_50.context[3] != -2)) &&
     (((local_50.context[3] & 0xffff) == 0xffff ||
      (((byte)(local_50.tree)->language->symbol_metadata[local_50.context[3] & 0xffff] & 2) != 0))))
  {
LAB_0012a513:
    ts_tree_set_cached_parent(self.tree,&local_50,__return_storage_ptr__);
    __return_storage_ptr__->context[0] = self.context[0];
    __return_storage_ptr__->context[1] = self.context[1];
    __return_storage_ptr__->context[2] = uVar3;
    __return_storage_ptr__->context[3] = uVar2;
    __return_storage_ptr__->id = self.id;
    __return_storage_ptr__->tree = pTVar7;
  }
  goto LAB_0012a3fa;
}

Assistant:

TSNode ts_node_named_descendant_for_byte_range(TSNode self, uint32_t min, uint32_t max) {
  return ts_node__descendant_for_byte_range(self, min, max, false);
}